

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O2

void Abc_EnumerateFunctions(int nDecMax)

{
  ulong uVar1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  void *__ptr;
  abctime aVar7;
  ulong uVar8;
  ulong uVar9;
  abctime time;
  char *pStr;
  int *__s;
  ulong uVar10;
  int i;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int local_898;
  int nFuncs;
  int nVars;
  ulong local_858;
  ulong local_850;
  ulong local_848;
  abctime local_840;
  long local_838;
  ulong local_830;
  ulong local_828;
  ulong local_820;
  ulong local_818;
  int nMints;
  int GateCount [100];
  int FuncDone [100];
  uint pFuncs [100];
  uint pVars [100];
  uint pMints [100];
  
  uVar13 = 0;
  memset(pVars,0,400);
  memset(pMints,0,400);
  memset(pFuncs,0,400);
  memset(FuncDone,0,400);
  __s = GateCount;
  memset(__s,0,400);
  iVar12 = (int)__s;
  local_840 = Abc_Clock();
  p = Vec_IntAlloc(iVar12);
  p_00 = Vec_IntAlloc(iVar12);
  Abc_GetSecond(&nVars,&nMints,&nFuncs,pVars,pMints,pFuncs);
  if ((nMints != 0x10) && (nMints != 0x20)) {
    __assert_fail("nMints == 16 || nMints == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                  ,0x153,"void Abc_EnumerateFunctions(int)");
  }
  local_858 = 1;
  __ptr = calloc((ulong)(uint)(1 << ((char)nMints - 3U & 0x1f)),1);
  uVar10 = 0;
  if (0 < nVars) {
    uVar10 = (ulong)(uint)nVars;
  }
  for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
    uVar5 = pVars[uVar13];
    puVar2 = (ulong *)((long)__ptr + (ulong)(uVar5 >> 6) * 8);
    *puVar2 = *puVar2 ^ (long)(1 << ((byte)uVar5 & 0x1f));
    Vec_IntPush(p_00,uVar5);
    Vec_IntPush(p,-1);
    Vec_IntPush(p,-1);
  }
  GateCount[0] = 0;
  GateCount[1] = nVars;
  if (p_00->nSize != nVars) {
    __assert_fail("Vec_IntSize(vTruths) == nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                  ,0x163,"void Abc_EnumerateFunctions(int)");
  }
  uVar13 = 0;
  if (0 < nFuncs) {
    uVar13 = (ulong)(uint)nFuncs;
  }
  local_838 = (long)nDecMax;
  local_898 = 0;
  uVar10 = 0;
  while (((long)uVar10 < local_838 && (local_898 < nFuncs))) {
    uVar1 = uVar10 + 1;
    uVar8 = 0;
    uVar9 = uVar10;
    local_830 = uVar10;
    while (uVar8 != local_858) {
      local_850 = uVar8 + 1;
      uVar11 = uVar8;
      while (uVar11 <= uVar9) {
        if (uVar10 == uVar11) {
          local_820 = uVar10;
          printf("Trying %d + %d + 1 = %d\n",uVar8 & 0xffffffff,uVar11 & 0xffffffff,uVar1);
          iVar3 = GateCount[local_850];
          local_828 = uVar11 + 1;
          local_848 = uVar8;
          local_818 = uVar11;
          for (iVar12 = GateCount[uVar8]; uVar10 = local_820, uVar9 = local_830, uVar11 = local_828,
              iVar12 < iVar3; iVar12 = iVar12 + 1) {
            iVar4 = GateCount[local_818 + 1];
            for (i = GateCount[local_818]; i < iVar4; i = i + 1) {
              if (iVar12 < i) {
                uVar5 = Vec_IntEntry(p_00,iVar12);
                uVar6 = Vec_IntEntry(p_00,i);
                uVar6 = uVar6 & uVar5;
                uVar10 = *(ulong *)((long)__ptr + (ulong)(uVar6 >> 6) * 8);
                uVar8 = (ulong)(1 << ((byte)uVar6 & 0x1f));
                if ((uVar10 & uVar8) == 0) {
                  *(ulong *)((long)__ptr + (ulong)(uVar6 >> 6) * 8) = uVar10 ^ uVar8;
                  Vec_IntPush(p_00,uVar6);
                  Vec_IntPush(p,iVar12);
                  Vec_IntPush(p,i);
                  for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
                    if ((FuncDone[uVar10] == 0) && (uVar6 == pFuncs[uVar10])) {
                      printf("Found function %d with %d gates: ",uVar10 & 0xffffffff,uVar1);
                      Abc_EnumPrint(p,p_00->nSize + -1,nVars);
                      FuncDone[uVar10] = 1;
                      local_898 = local_898 + 1;
                    }
                  }
                }
                uVar5 = Vec_IntEntry(p_00,iVar12);
                uVar6 = Vec_IntEntry(p_00,i);
                uVar6 = uVar6 | uVar5;
                uVar10 = *(ulong *)((long)__ptr + (ulong)(uVar6 >> 6) * 8);
                uVar9 = (ulong)(1 << ((byte)uVar6 & 0x1f));
                uVar8 = local_848;
                if ((uVar10 & uVar9) == 0) {
                  *(ulong *)((long)__ptr + (ulong)(uVar6 >> 6) * 8) = uVar10 ^ uVar9;
                  Vec_IntPush(p_00,uVar6);
                  Vec_IntPush(p,i);
                  Vec_IntPush(p,iVar12);
                  for (uVar10 = 0; uVar8 = local_848, uVar13 != uVar10; uVar10 = uVar10 + 1) {
                    if ((FuncDone[uVar10] == 0) && (uVar6 == pFuncs[uVar10])) {
                      printf("Found function %d with %d gates: ",uVar10 & 0xffffffff,uVar1);
                      Abc_EnumPrint(p,p_00->nSize + -1,nVars);
                      FuncDone[uVar10] = 1;
                      local_898 = local_898 + 1;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          uVar11 = uVar11 + 1;
        }
      }
      uVar10 = uVar10 - 1;
      uVar8 = local_850;
    }
    GateCount[uVar9 + 2] = p_00->nSize;
    pStr = (char *)(uVar1 & 0xffffffff);
    printf("Finished %d gates.  Truths = %10d.  ");
    aVar7 = Abc_Clock();
    Abc_PrintTime((int)aVar7 - (int)local_840,pStr,time);
    local_858 = local_858 + 1;
    uVar10 = uVar1;
  }
  free(__ptr);
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_EnumerateFunctions( int nDecMax )
{
    int nVars;
    int nMints;
    int nFuncs;
    unsigned pVars[100] = {0};
    unsigned pMints[100] = {0};
    unsigned pFuncs[100] = {0};
    unsigned Truth;
    int FuncDone[100] = {0}, nFuncDone = 0;
    int GateCount[100] = {0};
    int i, k, n, a, b, v;
    abctime clk = Abc_Clock();
    Vec_Int_t * vGates = Vec_IntAlloc( 100000 );
    Vec_Int_t * vTruths = Vec_IntAlloc( 100000 );
//    Vec_Int_t * vHash = Vec_IntStartFull( 1 << 16 );
    word * pHash;

    // extract data
//    Abc_GetFirst( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );
    Abc_GetSecond( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );
//    Abc_GetThird( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );

    // create hash table
    assert( nMints == 16 || nMints == 32 );
    pHash = (word *)ABC_CALLOC( char, 1 << (nMints-3) );

    // create elementary gates
    for ( k = 0; k < nVars; k++ )
    {
//        Vec_IntWriteEntry( vHash, pVars[k], k );
        Abc_DataXorBit( pHash, pVars[k] );
        Vec_IntPush( vTruths, pVars[k] );
        Vec_IntPush( vGates, -1 );
        Vec_IntPush( vGates, -1 );
    }

    // go through different number of variables
    GateCount[0] = 0;
    GateCount[1] = nVars;
    assert( Vec_IntSize(vTruths) == nVars );
    for ( n = 0; n < nDecMax && nFuncDone < nFuncs; n++ )
    {
        for ( a = 0; a <= n; a++ )
        for ( b = a; b <= n; b++ )
        if ( a + b == n )
        {
            printf( "Trying %d + %d + 1 = %d\n", a, b, n+1 );
            for ( i = GateCount[a]; i < GateCount[a+1]; i++ )
            for ( k = GateCount[b]; k < GateCount[b+1]; k++ )
            if ( i < k )
            {
                Truth = Vec_IntEntry(vTruths, i) & Vec_IntEntry(vTruths, k);
//                if ( Vec_IntEntry(vHash, Truth) == -1 )
                if ( !Abc_DataHasBit(pHash, Truth) )
                {
//                    Vec_IntWriteEntry( vHash, Truth, Vec_IntSize(vTruths) );
                    Abc_DataXorBit( pHash, Truth );
                    Vec_IntPush( vTruths, Truth );
                    Vec_IntPush( vGates, i );
                    Vec_IntPush( vGates, k );

                    for ( v = 0; v < nFuncs; v++ )
                    if ( !FuncDone[v] && Truth == pFuncs[v] )
                    {
                        printf( "Found function %d with %d gates: ", v, n+1 );
                        Abc_EnumPrint( vGates, Vec_IntSize(vTruths)-1, nVars );
                        FuncDone[v] = 1;
                        nFuncDone++;
                    }
                }
                Truth = Vec_IntEntry(vTruths, i) | Vec_IntEntry(vTruths, k);
//                if ( Vec_IntEntry(vHash, Truth) == -1 )
                if ( !Abc_DataHasBit(pHash, Truth) )
                {
//                    Vec_IntWriteEntry( vHash, Truth, Vec_IntSize(vTruths) );
                    Abc_DataXorBit( pHash, Truth );
                    Vec_IntPush( vTruths, Truth );
                    Vec_IntPush( vGates, k );
                    Vec_IntPush( vGates, i );

                    for ( v = 0; v < nFuncs; v++ )
                    if ( !FuncDone[v] && Truth == pFuncs[v] )
                    {
                        printf( "Found function %d with %d gates: ", v, n+1 );
                        Abc_EnumPrint( vGates, Vec_IntSize(vTruths)-1, nVars );
                        FuncDone[v] = 1;
                        nFuncDone++;
                    }
                }
            }
        }
        GateCount[n+2] = Vec_IntSize(vTruths);
        printf( "Finished %d gates.  Truths = %10d.  ", n+1, Vec_IntSize(vTruths) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    ABC_FREE( pHash );
//    Vec_IntFree( vHash );
    Vec_IntFree( vGates );
    Vec_IntFree( vTruths );
}